

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O3

void __thiscall duckdb::FixedSizeAllocator::NextBufferWithFreeSpace(FixedSizeAllocator *this)

{
  idx_t in_RAX;
  optional_idx local_18;
  
  if ((this->buffers_with_free_space)._M_h._M_element_count == 0) {
    local_18.index = 0xffffffffffffffff;
  }
  else {
    local_18.index = in_RAX;
    optional_idx::optional_idx
              (&local_18,
               (idx_t)(this->buffers_with_free_space)._M_h._M_before_begin._M_nxt[1]._M_nxt);
  }
  (this->buffer_with_free_space).index = local_18.index;
  return;
}

Assistant:

void FixedSizeAllocator::NextBufferWithFreeSpace() {
	if (!buffers_with_free_space.empty()) {
		buffer_with_free_space = *buffers_with_free_space.begin();
		return;
	}
	buffer_with_free_space.SetInvalid();
}